

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void DFS(bb_t_conflict bb,size_t *pre,size_t *rpost)

{
  size_t sVar1;
  out_edge_t local_28;
  edge_t_conflict e;
  size_t *rpost_local;
  size_t *pre_local;
  bb_t_conflict bb_local;
  
  sVar1 = *pre;
  *pre = sVar1 + 1;
  bb->pre = sVar1;
  for (local_28 = DLIST_out_edge_t_head(&bb->out_edges); local_28 != (out_edge_t)0x0;
      local_28 = DLIST_out_edge_t_next(local_28)) {
    if (local_28->dst->pre == 0) {
      DFS(local_28->dst,pre,rpost);
    }
    else if (local_28->dst->rpost == 0) {
      local_28->back_edge_p = '\x01';
    }
  }
  sVar1 = *rpost;
  *rpost = sVar1 - 1;
  bb->rpost = sVar1;
  return;
}

Assistant:

static void DFS (bb_t bb, size_t *pre, size_t *rpost) {
  edge_t e;

  bb->pre = (*pre)++;
  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e))
    if (e->dst->pre == 0)
      DFS (e->dst, pre, rpost);
    else if (e->dst->rpost == 0)
      e->back_edge_p = TRUE;
  bb->rpost = (*rpost)--;
}